

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O0

Var Js::HelperMethodWrapper<Js::HelperMethodWrapper0(Js::ScriptContext*,void*)::__0>
              (ScriptContext *scriptContext,anon_class_8_1_426fe81e fn)

{
  bool bVar1;
  ThreadContext *pTVar2;
  AutoRegisterIgnoreExceptionWrapper local_28;
  AutoRegisterIgnoreExceptionWrapper autoWrapper;
  ScriptContext *scriptContext_local;
  anon_class_8_1_426fe81e fn_local;
  
  autoWrapper.m_threadContext = (ThreadContext *)scriptContext;
  scriptContext_local = (ScriptContext *)fn.origHelperAddr;
  pTVar2 = ScriptContext::GetThreadContext(scriptContext);
  bVar1 = AutoRegisterIgnoreExceptionWrapper::IsRegistered(pTVar2);
  if (bVar1) {
    fn_local.origHelperAddr =
         HelperMethodWrapper0::anon_class_8_1_426fe81e::operator()
                   ((anon_class_8_1_426fe81e *)&scriptContext_local);
  }
  else {
    pTVar2 = ScriptContext::GetThreadContext(autoWrapper.m_threadContext);
    AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper(&local_28,pTVar2);
    fn_local.origHelperAddr =
         HelperOrLibraryMethodWrapper<false,Js::HelperMethodWrapper0(Js::ScriptContext*,void*)::__0>
                   ((ScriptContext *)autoWrapper.m_threadContext,
                    (anon_class_8_1_426fe81e)scriptContext_local);
    AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_28);
  }
  return fn_local.origHelperAddr;
}

Assistant:

Var HelperMethodWrapper(ScriptContext* scriptContext, Fn fn)
    {
        if (AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->GetThreadContext()))
        {
            return fn();
        }
        else
        {
            AutoRegisterIgnoreExceptionWrapper autoWrapper(scriptContext->GetThreadContext());
            return HelperOrLibraryMethodWrapper<false>(scriptContext, fn);
        }
    }